

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headers_sync_chainwork_tests.cpp
# Opt level: O3

void __thiscall
headers_sync_chainwork_tests::headers_sync_state::test_method(headers_sync_state *this)

{
  int iVar1;
  uint32_t prev_time;
  uint prev_time_00;
  ChainstateManager *pCVar2;
  void *pvVar3;
  _Head_base<0UL,_HeadersSyncState_*,_false> _Var4;
  char **ppcVar5;
  undefined8 uVar6;
  _Head_base<0UL,_kernel::Context_*,_false> _Var7;
  CChainParams *pCVar8;
  CBlockIndex *chain_start;
  HeadersSyncState *pHVar9;
  long lVar10;
  pointer pCVar11;
  HeadersGeneratorSetup *pHVar12;
  iterator pCVar13;
  arith_uint256 *paVar14;
  iterator pvVar15;
  iterator pvVar16;
  long in_FS_OFFSET;
  byte bVar17;
  initializer_list<CBlockHeader> __l;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  initializer_list<CBlockHeader> __l_00;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  vector<CBlockHeader,_std::allocator<CBlockHeader>_> second_chain;
  vector<CBlockHeader,_std::allocator<CBlockHeader>_> first_chain;
  vector<CBlockHeader,_std::allocator<CBlockHeader>_> headers_batch;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock23;
  check_type nBits;
  undefined4 in_stack_fffffffffffffb34;
  char *local_4b8;
  char *local_4b0;
  undefined1 *local_4a8;
  undefined1 *local_4a0;
  char *local_498;
  char *local_490;
  char *local_488;
  char *local_480;
  undefined1 *local_478;
  undefined1 *local_470;
  char *local_468;
  char *local_460;
  char *local_458;
  char *local_450;
  undefined1 *local_448;
  undefined1 *local_440;
  char *local_438;
  char *local_430;
  char *local_428;
  char *local_420;
  undefined1 *local_418;
  undefined1 *local_410;
  char *local_408;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  undefined1 *local_3e8;
  undefined1 *local_3e0;
  char *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  undefined1 *local_3b8;
  undefined1 *local_3b0;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  char *local_390;
  undefined1 *local_388;
  undefined1 *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  undefined1 *local_358;
  undefined1 *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  undefined1 *local_328;
  undefined1 *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  assertion_result local_1c8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  _Head_base<0UL,_HeadersSyncState_*,_false> local_190;
  vector<CBlockHeader,_std::allocator<CBlockHeader>_> local_188;
  vector<CBlockHeader,_std::allocator<CBlockHeader>_> local_168;
  ProcessingResult local_148;
  ProcessingResult local_128;
  ProcessingResult local_108;
  undefined1 local_e8 [8];
  pointer pCStack_e0;
  pointer local_d8;
  char **local_d0 [7];
  arith_uint256 local_98;
  undefined1 local_78 [16];
  _Head_base<0UL,_kernel::Context_*,_false> local_68;
  readonly_property<bool> local_60;
  readonly_property<bool> rStack_5f;
  undefined1 local_58 [32];
  _Head_base<0UL,_CTxMemPool_*,_false> local_38;
  
  bVar17 = 0;
  local_38._M_head_impl =
       *(CTxMemPool **)
        &((__uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_> *)(in_FS_OFFSET + 0x28))->
         _M_t;
  local_168.super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_168.super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188.super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_188.super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_190._M_head_impl = (HeadersSyncState *)0x0;
  local_58._0_4_ = 30000;
  local_58._4_4_ = 0;
  local_58._8_4_ = 0;
  local_58._12_4_ = 0;
  local_58._16_4_ = 0;
  local_58._20_4_ = 0;
  local_58._24_8_ = (__uniq_ptr_impl<CConnman,_std::default_delete<CConnman>_>)0x0;
  pCVar8 = Params();
  CBlockHeader::GetHash((uint256 *)local_e8,&(pCVar8->genesis).super_CBlockHeader);
  pCVar8 = Params();
  iVar1 = (pCVar8->genesis).super_CBlockHeader.nVersion;
  pCVar8 = Params();
  prev_time = (pCVar8->genesis).super_CBlockHeader.nTime;
  local_98.super_base_uint<256U>.pn[4] = 0;
  local_98.super_base_uint<256U>.pn[5] = 0;
  local_98.super_base_uint<256U>.pn[6] = 0;
  local_98.super_base_uint<256U>.pn[7] = 0;
  local_98.super_base_uint<256U>.pn[0] = 0;
  local_98.super_base_uint<256U>.pn[1] = 0;
  local_98.super_base_uint<256U>.pn[2] = 0;
  local_98.super_base_uint<256U>.pn[3] = 0;
  pHVar12 = (HeadersGeneratorSetup *)local_78;
  ArithToUint256((uint256 *)local_78,&local_98);
  pCVar8 = Params();
  HeadersGeneratorSetup::GenerateHeaders
            (pHVar12,&local_168,14999,(uint256 *)local_e8,iVar1,prev_time,(uint256 *)local_78,
             (pCVar8->genesis).super_CBlockHeader.nBits);
  pCVar8 = Params();
  CBlockHeader::GetHash((uint256 *)local_e8,&(pCVar8->genesis).super_CBlockHeader);
  pCVar8 = Params();
  iVar1 = (pCVar8->genesis).super_CBlockHeader.nVersion;
  pCVar8 = Params();
  prev_time_00 = (pCVar8->genesis).super_CBlockHeader.nTime;
  local_98.super_base_uint<256U>.pn[0] = 1;
  local_98.super_base_uint<256U>.pn[1] = 0;
  local_98.super_base_uint<256U>.pn[2] = 0;
  local_98.super_base_uint<256U>.pn[3] = 0;
  local_98.super_base_uint<256U>.pn[4] = 0;
  local_98.super_base_uint<256U>.pn[5] = 0;
  local_98.super_base_uint<256U>.pn[6] = 0;
  local_98.super_base_uint<256U>.pn[7] = 0;
  pHVar12 = (HeadersGeneratorSetup *)local_78;
  ArithToUint256((uint256 *)local_78,&local_98);
  pCVar8 = Params();
  nBits = (pCVar8->genesis).super_CBlockHeader.nBits;
  pvVar15 = (iterator)(ulong)prev_time_00;
  HeadersGeneratorSetup::GenerateHeaders
            (pHVar12,&local_188,0x3a96,(uint256 *)local_e8,iVar1,prev_time_00,(uint256 *)local_78,
             nBits);
  local_78._0_8_ = &cs_main;
  local_78._8_8_ = local_78._8_8_ & 0xffffffffffffff00;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)local_78);
  pCVar2 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_RegTestingSetup.super_TestingSetup.
           super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman._M_t.
           super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
           super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
           super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl;
  pCVar8 = Params();
  CBlockHeader::GetHash((uint256 *)local_e8,&(pCVar8->genesis).super_CBlockHeader);
  chain_start = ::node::BlockManager::LookupBlockIndex(&pCVar2->m_blockman,(uint256 *)local_e8);
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)local_78);
  local_98.super_base_uint<256U>.pn[0] = 0;
  local_98.super_base_uint<256U>.pn[1] = 0;
  local_98.super_base_uint<256U>.pn[2] = 0;
  local_98.super_base_uint<256U>.pn[3] = 0;
  local_98.super_base_uint<256U>.pn[4] = 0;
  local_98.super_base_uint<256U>.pn[5] = 0;
  std::vector<CBlockHeader,std::allocator<CBlockHeader>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<CBlockHeader*,std::vector<CBlockHeader,std::allocator<CBlockHeader>>>>
            ((vector<CBlockHeader,std::allocator<CBlockHeader>> *)&local_98,0,
             local_168.super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>._M_impl.
             super__Vector_impl_data._M_start + 1,
             local_168.super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>._M_impl.
             super__Vector_impl_data._M_finish);
  pHVar9 = (HeadersSyncState *)operator_new(0x1e8);
  pCVar8 = Params();
  paVar14 = (arith_uint256 *)local_58;
  HeadersSyncState::HeadersSyncState(pHVar9,0,&pCVar8->consensus,chain_start,paVar14);
  std::__uniq_ptr_impl<HeadersSyncState,_std::default_delete<HeadersSyncState>_>::reset
            ((__uniq_ptr_impl<HeadersSyncState,_std::default_delete<HeadersSyncState>_> *)&local_190
             ,pHVar9);
  _Var4._M_head_impl = local_190._M_head_impl;
  pCVar11 = local_168.super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>._M_impl.
            super__Vector_impl_data._M_start;
  pCVar13 = (iterator)local_e8;
  for (lVar10 = 0x14; lVar10 != 0; lVar10 = lVar10 + -1) {
    pCVar13->nVersion = pCVar11->nVersion;
    pCVar11 = (pointer)((long)pCVar11 + (ulong)bVar17 * -8 + 4);
    pCVar13 = (iterator)((long)pCVar13 + (ulong)bVar17 * -8 + 4);
  }
  __l._M_len = 1;
  __l._M_array = (iterator)local_e8;
  std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>::vector
            ((vector<CBlockHeader,_std::allocator<CBlockHeader>_> *)local_78,__l,
             (allocator_type *)&local_1c8);
  HeadersSyncState::ProcessNextHeaders
            (&local_108,_Var4._M_head_impl,
             (vector<CBlockHeader,_std::allocator<CBlockHeader>_> *)local_78,true);
  if (local_108.pow_validated_headers.
      super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.pow_validated_headers.
                    super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_108.pow_validated_headers.
                          super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.pow_validated_headers.
                          super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((pointer)local_78._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_78._0_8_,(long)local_68._M_head_impl - local_78._0_8_);
  }
  HeadersSyncState::ProcessNextHeaders
            ((ProcessingResult *)local_78,local_190._M_head_impl,
             (vector<CBlockHeader,_std::allocator<CBlockHeader>_> *)&local_98,true);
  local_1a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/headers_sync_chainwork_tests.cpp"
  ;
  local_198 = "";
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x66;
  file.m_begin = (iterator)&local_1a0;
  msg.m_end = pvVar15;
  msg.m_begin = (iterator)paVar14;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1b0,msg);
  local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)local_60.super_class_property<bool>.value;
  local_1c8.m_message.px = (element_type *)0x0;
  local_1c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1d8 = "result.success";
  local_1d0 = "";
  pCStack_e0 = (pointer)((ulong)pCStack_e0 & 0xffffffffffffff00);
  local_e8 = (undefined1  [8])&PTR__lazy_ostream_01389048;
  local_d8 = (pointer)boost::unit_test::lazy_ostream::inst;
  local_1e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/headers_sync_chainwork_tests.cpp"
  ;
  local_1e0 = "";
  pvVar15 = (iterator)0x1;
  pvVar16 = (iterator)0x0;
  local_d0[0] = &local_1d8;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c8,(lazy_ostream *)local_e8,1,0,WARN,CONCAT44(in_stack_fffffffffffffb34,nBits),
             (size_t)&local_1e8,0x66);
  boost::detail::shared_count::~shared_count(&local_1c8.m_message.pn);
  local_1f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/headers_sync_chainwork_tests.cpp"
  ;
  local_1f0 = "";
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x67;
  file_00.m_begin = (iterator)&local_1f8;
  msg_00.m_end = pvVar16;
  msg_00.m_begin = pvVar15;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_208,
             msg_00);
  local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rStack_5f.super_class_property<bool>.value;
  local_1c8.m_message.px = (element_type *)0x0;
  local_1c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1d8 = "result.request_more";
  local_1d0 = "";
  pCStack_e0 = (pointer)((ulong)pCStack_e0 & 0xffffffffffffff00);
  local_e8 = (undefined1  [8])&PTR__lazy_ostream_01389048;
  local_d8 = (pointer)boost::unit_test::lazy_ostream::inst;
  local_218 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/headers_sync_chainwork_tests.cpp"
  ;
  local_210 = "";
  pvVar15 = (iterator)0x1;
  pvVar16 = (iterator)0x0;
  local_d0[0] = &local_1d8;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c8,(lazy_ostream *)local_e8,1,0,WARN,CONCAT44(in_stack_fffffffffffffb34,nBits),
             (size_t)&local_218,0x67);
  boost::detail::shared_count::~shared_count(&local_1c8.m_message.pn);
  local_228 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/headers_sync_chainwork_tests.cpp"
  ;
  local_220 = "";
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = &DAT_00000068;
  file_01.m_begin = (iterator)&local_228;
  msg_01.m_end = pvVar16;
  msg_01.m_begin = pvVar15;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_238,
             msg_01);
  local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((local_190._M_head_impl)->m_download_state == REDOWNLOAD);
  local_1c8.m_message.px = (element_type *)0x0;
  local_1c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1d8 = "hss->GetState() == HeadersSyncState::State::REDOWNLOAD";
  local_1d0 = "";
  pCStack_e0 = (pointer)((ulong)pCStack_e0 & 0xffffffffffffff00);
  local_e8 = (undefined1  [8])&PTR__lazy_ostream_01389048;
  local_d8 = (pointer)boost::unit_test::lazy_ostream::inst;
  local_248 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/headers_sync_chainwork_tests.cpp"
  ;
  local_240 = "";
  pvVar15 = (iterator)0x1;
  pvVar16 = (iterator)0x0;
  local_d0[0] = &local_1d8;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c8,(lazy_ostream *)local_e8,1,0,WARN,CONCAT44(in_stack_fffffffffffffb34,nBits),
             (size_t)&local_248,0x68);
  boost::detail::shared_count::~shared_count(&local_1c8.m_message.pn);
  HeadersSyncState::ProcessNextHeaders
            ((ProcessingResult *)local_e8,local_190._M_head_impl,&local_188,true);
  _Var7._M_head_impl = local_68._M_head_impl;
  uVar6 = local_78._0_8_;
  ppcVar5 = local_d0[0];
  local_78._0_8_ = local_e8;
  local_78._8_8_ = pCStack_e0;
  local_68._M_head_impl = (Context *)local_d8;
  local_e8 = (undefined1  [8])0x0;
  pCStack_e0 = (pointer)0x0;
  local_d8 = (pointer)0x0;
  if ((pointer)uVar6 == (pointer)0x0) {
    local_60.super_class_property<bool>.value =
         (class_property<bool>)(class_property<bool>)(uchar)local_d0[0];
    rStack_5f.super_class_property<bool>.value =
         (class_property<bool>)(class_property<bool>)local_d0[0]._1_1_;
    local_d0[0] = ppcVar5;
  }
  else {
    operator_delete((void *)uVar6,(long)_Var7._M_head_impl - uVar6);
    ppcVar5 = local_d0[0];
    local_60.super_class_property<bool>.value =
         (class_property<bool>)(class_property<bool>)(uchar)local_d0[0];
    rStack_5f.super_class_property<bool>.value =
         (class_property<bool>)(class_property<bool>)local_d0[0]._1_1_;
    local_d0[0] = ppcVar5;
    if (local_e8 != (undefined1  [8])0x0) {
      operator_delete((void *)local_e8,(long)local_d8 - (long)local_e8);
    }
  }
  local_258 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/headers_sync_chainwork_tests.cpp"
  ;
  local_250 = "";
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x6c;
  file_02.m_begin = (iterator)&local_258;
  msg_02.m_end = pvVar16;
  msg_02.m_begin = pvVar15;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_268,
             msg_02);
  local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((byte)local_60.super_class_property<bool>.value ^ 1);
  local_1c8.m_message.px = (element_type *)0x0;
  local_1c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1d8 = "!result.success";
  local_1d0 = "";
  pCStack_e0 = (pointer)((ulong)pCStack_e0 & 0xffffffffffffff00);
  local_e8 = (undefined1  [8])&PTR__lazy_ostream_01389048;
  local_d8 = (pointer)boost::unit_test::lazy_ostream::inst;
  local_278 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/headers_sync_chainwork_tests.cpp"
  ;
  local_270 = "";
  pvVar15 = (iterator)0x1;
  pvVar16 = (iterator)0x0;
  local_d0[0] = &local_1d8;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c8,(lazy_ostream *)local_e8,1,0,WARN,CONCAT44(in_stack_fffffffffffffb34,nBits),
             (size_t)&local_278,0x6c);
  boost::detail::shared_count::~shared_count(&local_1c8.m_message.pn);
  local_288 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/headers_sync_chainwork_tests.cpp"
  ;
  local_280 = "";
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x6d;
  file_03.m_begin = (iterator)&local_288;
  msg_03.m_end = pvVar16;
  msg_03.m_begin = pvVar15;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_298,
             msg_03);
  local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((local_190._M_head_impl)->m_download_state == FINAL);
  local_1c8.m_message.px = (element_type *)0x0;
  local_1c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1d8 = "hss->GetState() == HeadersSyncState::State::FINAL";
  local_1d0 = "";
  pCStack_e0 = (pointer)((ulong)pCStack_e0 & 0xffffffffffffff00);
  local_e8 = (undefined1  [8])&PTR__lazy_ostream_01389048;
  local_d8 = (pointer)boost::unit_test::lazy_ostream::inst;
  local_2a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/headers_sync_chainwork_tests.cpp"
  ;
  local_2a0 = "";
  pvVar15 = (iterator)0x0;
  local_d0[0] = &local_1d8;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c8,(lazy_ostream *)local_e8,1,0,WARN,CONCAT44(in_stack_fffffffffffffb34,nBits),
             (size_t)&local_2a8,0x6d);
  boost::detail::shared_count::~shared_count(&local_1c8.m_message.pn);
  pHVar9 = (HeadersSyncState *)operator_new(0x1e8);
  pCVar8 = Params();
  paVar14 = (arith_uint256 *)local_58;
  HeadersSyncState::HeadersSyncState(pHVar9,0,&pCVar8->consensus,chain_start,paVar14);
  std::__uniq_ptr_impl<HeadersSyncState,_std::default_delete<HeadersSyncState>_>::reset
            ((__uniq_ptr_impl<HeadersSyncState,_std::default_delete<HeadersSyncState>_> *)&local_190
             ,pHVar9);
  HeadersSyncState::ProcessNextHeaders(&local_128,local_190._M_head_impl,&local_168,true);
  if (local_128.pow_validated_headers.
      super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_128.pow_validated_headers.
                    super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_128.pow_validated_headers.
                          super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.pow_validated_headers.
                          super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_2b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/headers_sync_chainwork_tests.cpp"
  ;
  local_2b0 = "";
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x72;
  file_04.m_begin = (iterator)&local_2b8;
  msg_04.m_end = pvVar15;
  msg_04.m_begin = (iterator)paVar14;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_2c8,
             msg_04);
  local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((local_190._M_head_impl)->m_download_state == REDOWNLOAD);
  local_1c8.m_message.px = (element_type *)0x0;
  local_1c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1d8 = "hss->GetState() == HeadersSyncState::State::REDOWNLOAD";
  local_1d0 = "";
  pCStack_e0 = (pointer)((ulong)pCStack_e0 & 0xffffffffffffff00);
  local_e8 = (undefined1  [8])&PTR__lazy_ostream_01389048;
  local_d8 = (pointer)boost::unit_test::lazy_ostream::inst;
  local_2d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/headers_sync_chainwork_tests.cpp"
  ;
  local_2d0 = "";
  pvVar15 = (iterator)0x1;
  pvVar16 = (iterator)0x0;
  local_d0[0] = &local_1d8;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c8,(lazy_ostream *)local_e8,1,0,WARN,CONCAT44(in_stack_fffffffffffffb34,nBits),
             (size_t)&local_2d8,0x72);
  boost::detail::shared_count::~shared_count(&local_1c8.m_message.pn);
  HeadersSyncState::ProcessNextHeaders
            ((ProcessingResult *)local_e8,local_190._M_head_impl,&local_168,true);
  _Var7._M_head_impl = local_68._M_head_impl;
  uVar6 = local_78._0_8_;
  ppcVar5 = local_d0[0];
  local_78._0_8_ = local_e8;
  local_78._8_8_ = pCStack_e0;
  local_68._M_head_impl = (Context *)local_d8;
  local_e8 = (undefined1  [8])0x0;
  pCStack_e0 = (pointer)0x0;
  local_d8 = (pointer)0x0;
  if ((pointer)uVar6 == (pointer)0x0) {
    local_60.super_class_property<bool>.value =
         (class_property<bool>)(class_property<bool>)(uchar)local_d0[0];
    rStack_5f.super_class_property<bool>.value =
         (class_property<bool>)(class_property<bool>)local_d0[0]._1_1_;
    local_d0[0] = ppcVar5;
  }
  else {
    operator_delete((void *)uVar6,(long)_Var7._M_head_impl - uVar6);
    ppcVar5 = local_d0[0];
    local_60.super_class_property<bool>.value =
         (class_property<bool>)(class_property<bool>)(uchar)local_d0[0];
    rStack_5f.super_class_property<bool>.value =
         (class_property<bool>)(class_property<bool>)local_d0[0]._1_1_;
    local_d0[0] = ppcVar5;
    if (local_e8 != (undefined1  [8])0x0) {
      operator_delete((void *)local_e8,(long)local_d8 - (long)local_e8);
    }
  }
  local_2e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/headers_sync_chainwork_tests.cpp"
  ;
  local_2e0 = "";
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = &DAT_00000075;
  file_05.m_begin = (iterator)&local_2e8;
  msg_05.m_end = pvVar16;
  msg_05.m_begin = pvVar15;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_2f8,
             msg_05);
  local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)local_60.super_class_property<bool>.value;
  local_1c8.m_message.px = (element_type *)0x0;
  local_1c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1d8 = "result.success";
  local_1d0 = "";
  pCStack_e0 = (pointer)((ulong)pCStack_e0 & 0xffffffffffffff00);
  local_e8 = (undefined1  [8])&PTR__lazy_ostream_01389048;
  local_d8 = (pointer)boost::unit_test::lazy_ostream::inst;
  local_308 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/headers_sync_chainwork_tests.cpp"
  ;
  local_300 = "";
  pvVar15 = (iterator)0x1;
  pvVar16 = (iterator)0x0;
  local_d0[0] = &local_1d8;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c8,(lazy_ostream *)local_e8,1,0,WARN,CONCAT44(in_stack_fffffffffffffb34,nBits),
             (size_t)&local_308,0x75);
  boost::detail::shared_count::~shared_count(&local_1c8.m_message.pn);
  local_318 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/headers_sync_chainwork_tests.cpp"
  ;
  local_310 = "";
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x76;
  file_06.m_begin = (iterator)&local_318;
  msg_06.m_end = pvVar16;
  msg_06.m_begin = pvVar15;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_328,
             msg_06);
  local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((byte)rStack_5f.super_class_property<bool>.value ^ 1);
  local_1c8.m_message.px = (element_type *)0x0;
  local_1c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1d8 = "!result.request_more";
  local_1d0 = "";
  pCStack_e0 = (pointer)((ulong)pCStack_e0 & 0xffffffffffffff00);
  local_e8 = (undefined1  [8])&PTR__lazy_ostream_01389048;
  local_d8 = (pointer)boost::unit_test::lazy_ostream::inst;
  local_338 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/headers_sync_chainwork_tests.cpp"
  ;
  local_330 = "";
  pvVar15 = (iterator)0x1;
  pvVar16 = (iterator)0x0;
  local_d0[0] = &local_1d8;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c8,(lazy_ostream *)local_e8,1,0,WARN,CONCAT44(in_stack_fffffffffffffb34,nBits),
             (size_t)&local_338,0x76);
  boost::detail::shared_count::~shared_count(&local_1c8.m_message.pn);
  local_348 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/headers_sync_chainwork_tests.cpp"
  ;
  local_340 = "";
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x78;
  file_07.m_begin = (iterator)&local_348;
  msg_07.m_end = pvVar16;
  msg_07.m_begin = pvVar15;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_358,
             msg_07);
  local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (local_78._8_8_ - local_78._0_8_ ==
       (long)local_168.super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_168.super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>._M_impl.
             super__Vector_impl_data._M_start);
  local_1c8.m_message.px = (element_type *)0x0;
  local_1c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1d8 = "result.pow_validated_headers.size() == first_chain.size()";
  local_1d0 = "";
  pCStack_e0 = (pointer)((ulong)pCStack_e0 & 0xffffffffffffff00);
  local_e8 = (undefined1  [8])&PTR__lazy_ostream_01389048;
  local_d8 = (pointer)boost::unit_test::lazy_ostream::inst;
  local_368 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/headers_sync_chainwork_tests.cpp"
  ;
  local_360 = "";
  pvVar15 = (iterator)0x1;
  pvVar16 = (iterator)0x0;
  local_d0[0] = &local_1d8;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c8,(lazy_ostream *)local_e8,1,0,WARN,CONCAT44(in_stack_fffffffffffffb34,nBits),
             (size_t)&local_368,0x78);
  boost::detail::shared_count::~shared_count(&local_1c8.m_message.pn);
  local_378 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/headers_sync_chainwork_tests.cpp"
  ;
  local_370 = "";
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x7a;
  file_08.m_begin = (iterator)&local_378;
  msg_08.m_end = pvVar16;
  msg_08.m_begin = pvVar15;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_388,
             msg_08);
  local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((local_190._M_head_impl)->m_download_state == FINAL);
  local_1c8.m_message.px = (element_type *)0x0;
  local_1c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1d8 = "hss->GetState() == HeadersSyncState::State::FINAL";
  local_1d0 = "";
  pCStack_e0 = (pointer)((ulong)pCStack_e0 & 0xffffffffffffff00);
  local_e8 = (undefined1  [8])&PTR__lazy_ostream_01389048;
  local_d8 = (pointer)boost::unit_test::lazy_ostream::inst;
  local_398 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/headers_sync_chainwork_tests.cpp"
  ;
  local_390 = "";
  pvVar15 = (iterator)0x0;
  local_d0[0] = &local_1d8;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c8,(lazy_ostream *)local_e8,1,0,WARN,CONCAT44(in_stack_fffffffffffffb34,nBits),
             (size_t)&local_398,0x7a);
  boost::detail::shared_count::~shared_count(&local_1c8.m_message.pn);
  pHVar9 = (HeadersSyncState *)operator_new(0x1e8);
  pCVar8 = Params();
  paVar14 = (arith_uint256 *)local_58;
  HeadersSyncState::HeadersSyncState(pHVar9,0,&pCVar8->consensus,chain_start,paVar14);
  std::__uniq_ptr_impl<HeadersSyncState,_std::default_delete<HeadersSyncState>_>::reset
            ((__uniq_ptr_impl<HeadersSyncState,_std::default_delete<HeadersSyncState>_> *)&local_190
             ,pHVar9);
  local_3a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/headers_sync_chainwork_tests.cpp"
  ;
  local_3a0 = "";
  local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x7f;
  file_09.m_begin = (iterator)&local_3a8;
  msg_09.m_end = pvVar15;
  msg_09.m_begin = (iterator)paVar14;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_3b8,
             msg_09);
  local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((local_190._M_head_impl)->m_download_state == PRESYNC);
  local_1c8.m_message.px = (element_type *)0x0;
  local_1c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1d8 = "hss->GetState() == HeadersSyncState::State::PRESYNC";
  local_1d0 = "";
  pCStack_e0 = (pointer)((ulong)pCStack_e0 & 0xffffffffffffff00);
  local_e8 = (undefined1  [8])&PTR__lazy_ostream_01389048;
  local_d8 = (pointer)boost::unit_test::lazy_ostream::inst;
  local_3c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/headers_sync_chainwork_tests.cpp"
  ;
  local_3c0 = "";
  pvVar15 = (iterator)0x1;
  pvVar16 = (iterator)0x0;
  local_d0[0] = &local_1d8;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c8,(lazy_ostream *)local_e8,1,0,WARN,CONCAT44(in_stack_fffffffffffffb34,nBits),
             (size_t)&local_3c8,0x7f);
  boost::detail::shared_count::~shared_count(&local_1c8.m_message.pn);
  _Var4._M_head_impl = local_190._M_head_impl;
  pCVar11 = local_188.super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>._M_impl.
            super__Vector_impl_data._M_start;
  pCVar13 = (iterator)local_e8;
  for (lVar10 = 0x14; lVar10 != 0; lVar10 = lVar10 + -1) {
    pCVar13->nVersion = pCVar11->nVersion;
    pCVar11 = (pointer)((long)pCVar11 + (ulong)bVar17 * -8 + 4);
    pCVar13 = (iterator)((long)pCVar13 + (ulong)bVar17 * -8 + 4);
  }
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_e8;
  std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>::vector
            ((vector<CBlockHeader,_std::allocator<CBlockHeader>_> *)&local_1c8,__l_00,
             (allocator_type *)&local_1d8);
  HeadersSyncState::ProcessNextHeaders
            (&local_148,_Var4._M_head_impl,
             (vector<CBlockHeader,_std::allocator<CBlockHeader>_> *)&local_1c8,true);
  if (local_148.pow_validated_headers.
      super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_148.pow_validated_headers.
                    super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_148.pow_validated_headers.
                          super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_148.pow_validated_headers.
                          super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pvVar3 = (void *)CONCAT71(local_1c8._1_7_,
                            local_1c8.p_predicate_value.super_readonly_property<bool>.
                            super_class_property<bool>.value);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,(long)local_1c8.m_message.pn.pi_ - (long)pvVar3);
  }
  local_3d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/headers_sync_chainwork_tests.cpp"
  ;
  local_3d0 = "";
  local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x82;
  file_10.m_begin = (iterator)&local_3d8;
  msg_10.m_end = pvVar16;
  msg_10.m_begin = pvVar15;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_3e8,
             msg_10);
  local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((local_190._M_head_impl)->m_download_state == PRESYNC);
  local_1c8.m_message.px = (element_type *)0x0;
  local_1c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1d8 = "hss->GetState() == HeadersSyncState::State::PRESYNC";
  local_1d0 = "";
  pCStack_e0 = (pointer)((ulong)pCStack_e0 & 0xffffffffffffff00);
  local_e8 = (undefined1  [8])&PTR__lazy_ostream_01389048;
  local_d8 = (pointer)boost::unit_test::lazy_ostream::inst;
  local_d0[0] = &local_1d8;
  local_3f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/headers_sync_chainwork_tests.cpp"
  ;
  local_3f0 = "";
  pvVar15 = (iterator)0x1;
  pvVar16 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c8,(lazy_ostream *)local_e8,1,0,WARN,CONCAT44(in_stack_fffffffffffffb34,nBits),
             (size_t)&local_3f8,0x82);
  boost::detail::shared_count::~shared_count(&local_1c8.m_message.pn);
  if (CONCAT44(local_98.super_base_uint<256U>.pn[3],local_98.super_base_uint<256U>.pn[2]) !=
      CONCAT44(local_98.super_base_uint<256U>.pn[1],local_98.super_base_uint<256U>.pn[0])) {
    local_98.super_base_uint<256U>.pn[2] = local_98.super_base_uint<256U>.pn[0];
    local_98.super_base_uint<256U>.pn[3] = local_98.super_base_uint<256U>.pn[1];
  }
  std::vector<CBlockHeader,std::allocator<CBlockHeader>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<CBlockHeader*,std::vector<CBlockHeader,std::allocator<CBlockHeader>>>>
            ((vector<CBlockHeader,std::allocator<CBlockHeader>> *)&local_98,
             CONCAT44(local_98.super_base_uint<256U>.pn[1],local_98.super_base_uint<256U>.pn[0]),
             local_188.super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>._M_impl.
             super__Vector_impl_data._M_start + 1);
  HeadersSyncState::ProcessNextHeaders
            ((ProcessingResult *)local_e8,local_190._M_head_impl,
             (vector<CBlockHeader,_std::allocator<CBlockHeader>_> *)&local_98,false);
  _Var7._M_head_impl = local_68._M_head_impl;
  uVar6 = local_78._0_8_;
  ppcVar5 = local_d0[0];
  local_78._0_8_ = local_e8;
  local_78._8_8_ = pCStack_e0;
  local_68._M_head_impl = (Context *)local_d8;
  local_e8 = (undefined1  [8])0x0;
  pCStack_e0 = (pointer)0x0;
  local_d8 = (pointer)0x0;
  if ((pointer)uVar6 == (pointer)0x0) {
    local_60.super_class_property<bool>.value =
         (class_property<bool>)(class_property<bool>)(uchar)local_d0[0];
    rStack_5f.super_class_property<bool>.value =
         (class_property<bool>)(class_property<bool>)local_d0[0]._1_1_;
    local_d0[0] = ppcVar5;
  }
  else {
    operator_delete((void *)uVar6,(long)_Var7._M_head_impl - uVar6);
    ppcVar5 = local_d0[0];
    local_60.super_class_property<bool>.value =
         (class_property<bool>)(class_property<bool>)(uchar)local_d0[0];
    rStack_5f.super_class_property<bool>.value =
         (class_property<bool>)(class_property<bool>)local_d0[0]._1_1_;
    local_d0[0] = ppcVar5;
    if (local_e8 != (undefined1  [8])0x0) {
      operator_delete((void *)local_e8,(long)local_d8 - (long)local_e8);
    }
  }
  local_408 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/headers_sync_chainwork_tests.cpp"
  ;
  local_400 = "";
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x8a;
  file_11.m_begin = (iterator)&local_408;
  msg_11.m_end = pvVar16;
  msg_11.m_begin = pvVar15;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_418,
             msg_11);
  local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((local_190._M_head_impl)->m_download_state == FINAL);
  local_1c8.m_message.px = (element_type *)0x0;
  local_1c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1d8 = "hss->GetState() == HeadersSyncState::State::FINAL";
  local_1d0 = "";
  pCStack_e0 = (pointer)((ulong)pCStack_e0 & 0xffffffffffffff00);
  local_e8 = (undefined1  [8])&PTR__lazy_ostream_01389048;
  local_d8 = (pointer)boost::unit_test::lazy_ostream::inst;
  local_d0[0] = &local_1d8;
  local_428 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/headers_sync_chainwork_tests.cpp"
  ;
  local_420 = "";
  pvVar15 = (iterator)0x1;
  pvVar16 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c8,(lazy_ostream *)local_e8,1,0,WARN,CONCAT44(in_stack_fffffffffffffb34,nBits),
             (size_t)&local_428,0x8a);
  boost::detail::shared_count::~shared_count(&local_1c8.m_message.pn);
  local_438 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/headers_sync_chainwork_tests.cpp"
  ;
  local_430 = "";
  local_448 = &boost::unit_test::basic_cstring<char_const>::null;
  local_440 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x8b;
  file_12.m_begin = (iterator)&local_438;
  msg_12.m_end = pvVar16;
  msg_12.m_begin = pvVar15;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_448,
             msg_12);
  local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_78._0_8_ == local_78._8_8_);
  local_1c8.m_message.px = (element_type *)0x0;
  local_1c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1d8 = "result.pow_validated_headers.empty()";
  local_1d0 = "";
  pCStack_e0 = (pointer)((ulong)pCStack_e0 & 0xffffffffffffff00);
  local_e8 = (undefined1  [8])&PTR__lazy_ostream_01389048;
  local_d8 = (pointer)boost::unit_test::lazy_ostream::inst;
  local_d0[0] = &local_1d8;
  local_458 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/headers_sync_chainwork_tests.cpp"
  ;
  local_450 = "";
  pvVar15 = (iterator)0x1;
  pvVar16 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c8,(lazy_ostream *)local_e8,1,0,WARN,CONCAT44(in_stack_fffffffffffffb34,nBits),
             (size_t)&local_458,0x8b);
  boost::detail::shared_count::~shared_count(&local_1c8.m_message.pn);
  local_468 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/headers_sync_chainwork_tests.cpp"
  ;
  local_460 = "";
  local_478 = &boost::unit_test::basic_cstring<char_const>::null;
  local_470 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x8c;
  file_13.m_begin = (iterator)&local_468;
  msg_13.m_end = pvVar16;
  msg_13.m_begin = pvVar15;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_478,
             msg_13);
  local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((byte)rStack_5f.super_class_property<bool>.value ^ 1);
  local_1c8.m_message.px = (element_type *)0x0;
  local_1c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1d8 = "!result.request_more";
  local_1d0 = "";
  pCStack_e0 = (pointer)((ulong)pCStack_e0 & 0xffffffffffffff00);
  local_e8 = (undefined1  [8])&PTR__lazy_ostream_01389048;
  local_d8 = (pointer)boost::unit_test::lazy_ostream::inst;
  local_d0[0] = &local_1d8;
  local_488 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/headers_sync_chainwork_tests.cpp"
  ;
  local_480 = "";
  pvVar15 = (iterator)0x1;
  pvVar16 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c8,(lazy_ostream *)local_e8,1,0,WARN,CONCAT44(in_stack_fffffffffffffb34,nBits),
             (size_t)&local_488,0x8c);
  boost::detail::shared_count::~shared_count(&local_1c8.m_message.pn);
  local_498 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/headers_sync_chainwork_tests.cpp"
  ;
  local_490 = "";
  local_4a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0x8f;
  file_14.m_begin = (iterator)&local_498;
  msg_14.m_end = pvVar16;
  msg_14.m_begin = pvVar15;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_4a8,
             msg_14);
  local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)local_60.super_class_property<bool>.value;
  local_1c8.m_message.px = (element_type *)0x0;
  local_1c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1d8 = "result.success";
  local_1d0 = "";
  pCStack_e0 = (pointer)((ulong)pCStack_e0 & 0xffffffffffffff00);
  local_e8 = (undefined1  [8])&PTR__lazy_ostream_01389048;
  local_d8 = (pointer)boost::unit_test::lazy_ostream::inst;
  local_d0[0] = &local_1d8;
  local_4b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/headers_sync_chainwork_tests.cpp"
  ;
  local_4b0 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_1c8,(lazy_ostream *)local_e8,1,0,WARN,CONCAT44(in_stack_fffffffffffffb34,nBits),
             (size_t)&local_4b8,0x8f);
  boost::detail::shared_count::~shared_count(&local_1c8.m_message.pn);
  if ((pointer)local_78._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_78._0_8_,(long)local_68._M_head_impl - local_78._0_8_);
  }
  pvVar3 = (void *)CONCAT44(local_98.super_base_uint<256U>.pn[1],
                            local_98.super_base_uint<256U>.pn[0]);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,CONCAT44(local_98.super_base_uint<256U>.pn[5],
                                    local_98.super_base_uint<256U>.pn[4]) - (long)pvVar3);
  }
  _Var4._M_head_impl = local_190._M_head_impl;
  if (local_190._M_head_impl != (HeadersSyncState *)0x0) {
    std::_Deque_base<CompressedHeader,_std::allocator<CompressedHeader>_>::~_Deque_base
              (&((local_190._M_head_impl)->m_redownloaded_headers).
                super__Deque_base<CompressedHeader,_std::allocator<CompressedHeader>_>);
    std::_Deque_base<std::bitset<32768UL>,_std::allocator<std::bitset<32768UL>_>_>::~_Deque_base
              ((_Deque_base<std::bitset<32768UL>,_std::allocator<std::bitset<32768UL>_>_> *)
               &(_Var4._M_head_impl)->m_header_commitments);
    operator_delete(_Var4._M_head_impl,0x1e8);
  }
  if (local_188.super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_188.super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_188.super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_188.super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_168.super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_168.super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_168.super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (*(CTxMemPool **)(in_FS_OFFSET + 0x28) == local_38._M_head_impl) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(headers_sync_state)
{
    std::vector<CBlockHeader> first_chain;
    std::vector<CBlockHeader> second_chain;

    std::unique_ptr<HeadersSyncState> hss;

    const int target_blocks = 15000;
    arith_uint256 chain_work = target_blocks*2;

    // Generate headers for two different chains (using differing merkle roots
    // to ensure the headers are different).
    GenerateHeaders(first_chain, target_blocks-1, Params().GenesisBlock().GetHash(),
            Params().GenesisBlock().nVersion, Params().GenesisBlock().nTime,
            ArithToUint256(0), Params().GenesisBlock().nBits);

    GenerateHeaders(second_chain, target_blocks-2, Params().GenesisBlock().GetHash(),
            Params().GenesisBlock().nVersion, Params().GenesisBlock().nTime,
            ArithToUint256(1), Params().GenesisBlock().nBits);

    const CBlockIndex* chain_start = WITH_LOCK(::cs_main, return m_node.chainman->m_blockman.LookupBlockIndex(Params().GenesisBlock().GetHash()));
    std::vector<CBlockHeader> headers_batch;

    // Feed the first chain to HeadersSyncState, by delivering 1 header
    // initially and then the rest.
    headers_batch.insert(headers_batch.end(), std::next(first_chain.begin()), first_chain.end());

    hss.reset(new HeadersSyncState(0, Params().GetConsensus(), chain_start, chain_work));
    (void)hss->ProcessNextHeaders({first_chain.front()}, true);
    // Pretend the first header is still "full", so we don't abort.
    auto result = hss->ProcessNextHeaders(headers_batch, true);

    // This chain should look valid, and we should have met the proof-of-work
    // requirement.
    BOOST_CHECK(result.success);
    BOOST_CHECK(result.request_more);
    BOOST_CHECK(hss->GetState() == HeadersSyncState::State::REDOWNLOAD);

    // Try to sneakily feed back the second chain.
    result = hss->ProcessNextHeaders(second_chain, true);
    BOOST_CHECK(!result.success); // foiled!
    BOOST_CHECK(hss->GetState() == HeadersSyncState::State::FINAL);

    // Now try again, this time feeding the first chain twice.
    hss.reset(new HeadersSyncState(0, Params().GetConsensus(), chain_start, chain_work));
    (void)hss->ProcessNextHeaders(first_chain, true);
    BOOST_CHECK(hss->GetState() == HeadersSyncState::State::REDOWNLOAD);

    result = hss->ProcessNextHeaders(first_chain, true);
    BOOST_CHECK(result.success);
    BOOST_CHECK(!result.request_more);
    // All headers should be ready for acceptance:
    BOOST_CHECK(result.pow_validated_headers.size() == first_chain.size());
    // Nothing left for the sync logic to do:
    BOOST_CHECK(hss->GetState() == HeadersSyncState::State::FINAL);

    // Finally, verify that just trying to process the second chain would not
    // succeed (too little work)
    hss.reset(new HeadersSyncState(0, Params().GetConsensus(), chain_start, chain_work));
    BOOST_CHECK(hss->GetState() == HeadersSyncState::State::PRESYNC);
     // Pretend just the first message is "full", so we don't abort.
    (void)hss->ProcessNextHeaders({second_chain.front()}, true);
    BOOST_CHECK(hss->GetState() == HeadersSyncState::State::PRESYNC);

    headers_batch.clear();
    headers_batch.insert(headers_batch.end(), std::next(second_chain.begin(), 1), second_chain.end());
    // Tell the sync logic that the headers message was not full, implying no
    // more headers can be requested. For a low-work-chain, this should causes
    // the sync to end with no headers for acceptance.
    result = hss->ProcessNextHeaders(headers_batch, false);
    BOOST_CHECK(hss->GetState() == HeadersSyncState::State::FINAL);
    BOOST_CHECK(result.pow_validated_headers.empty());
    BOOST_CHECK(!result.request_more);
    // Nevertheless, no validation errors should have been detected with the
    // chain:
    BOOST_CHECK(result.success);
}